

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall CS248::DynamicScene::Scene::bevel_selected_element(Scene *this)

{
  SceneObject *pSVar1;
  HalfedgeElement *pHVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  Mesh *this_00;
  
  if ((this->edited).element != (this->selected).element) {
    pSVar1 = (this->selected).object;
    if (pSVar1 == (SceneObject *)0x0) {
      this_00 = (Mesh *)0x0;
    }
    else {
      this_00 = (Mesh *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    if (this_00 != (Mesh *)0x0) {
      Mesh::bevel_selected_element(this_00);
      pSVar1 = (this->selected).object;
      pHVar2 = (this->selected).element;
      dVar3 = (this->selected).coordinates.x;
      dVar4 = (this->selected).coordinates.y;
      uVar5 = *(undefined8 *)((long)&(this->selected).coordinates.z + 4);
      *(undefined8 *)((long)&(this->edited).coordinates.y + 4) =
           *(undefined8 *)((long)&(this->selected).coordinates.y + 4);
      *(undefined8 *)((long)&(this->edited).coordinates.z + 4) = uVar5;
      (this->edited).coordinates.x = dVar3;
      (this->edited).coordinates.y = dVar4;
      (this->edited).object = pSVar1;
      (this->edited).element = pHVar2;
    }
  }
  return;
}

Assistant:

void Scene::bevel_selected_element() {
  // Don't re-bevel an element that we're already editing (i.e., beveling)
  if (edited.element == selected.element) return;

  Mesh *mesh = dynamic_cast<Mesh *>(selected.object);
  if (mesh) {
    mesh->bevel_selected_element();
    edited = selected;
  }
}